

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::ExpandSpecialVariable
          (cmCommandArgumentParserHelper *this,char *key,char *var)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  cmState *this_00;
  char *pcVar4;
  ostream *poVar5;
  string local_2b8;
  ostringstream local_298 [8];
  ostringstream e;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  string local_d0;
  allocator local_a9;
  string local_a8;
  char *local_88;
  char *c;
  string local_78;
  undefined1 local_48 [8];
  string str;
  char *var_local;
  char *key_local;
  cmCommandArgumentParserHelper *this_local;
  
  str.field_2._8_8_ = var;
  if (key == (char *)0x0) {
    this_local = (cmCommandArgumentParserHelper *)ExpandVariable(this,var);
  }
  else {
    this_local = this;
    if (var != (char *)0x0) {
      iVar3 = strcmp(key,"ENV");
      if (iVar3 == 0) {
        std::__cxx11::string::string((string *)local_48);
        bVar2 = cmsys::SystemTools::GetEnv((char *)str.field_2._8_8_,(string *)local_48);
        if (bVar2) {
          if ((this->EscapeQuotes & 1U) == 0) {
            this_local = (cmCommandArgumentParserHelper *)AddString(this,(string *)local_48);
          }
          else {
            cmSystemTools::EscapeQuotes(&local_78,(string *)local_48);
            this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
          }
        }
        c._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_48);
      }
      else {
        iVar3 = strcmp(key,"CACHE");
        if (iVar3 == 0) {
          this_00 = cmMakefile::GetState(this->Makefile);
          uVar1 = str.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_a8,(char *)uVar1,&local_a9);
          pcVar4 = cmState::GetInitializedCacheValue(this_00,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_a9);
          if (pcVar4 != (char *)0x0) {
            local_88 = pcVar4;
            if ((this->EscapeQuotes & 1U) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_118,pcVar4,&local_119);
              this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_118);
              std::__cxx11::string::~string((string *)&local_118);
              std::allocator<char>::~allocator((allocator<char> *)&local_119);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_f0,pcVar4,&local_f1);
              cmSystemTools::EscapeQuotes(&local_d0,&local_f0);
              this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_d0);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_f0);
              std::allocator<char>::~allocator((allocator<char> *)&local_f1);
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_298);
          poVar5 = std::operator<<((ostream *)local_298,"Syntax $");
          poVar5 = std::operator<<(poVar5,key);
          poVar5 = std::operator<<(poVar5,"{} is not supported.  ");
          std::operator<<(poVar5,"Only ${}, $ENV{}, and $CACHE{} are allowed.");
          std::__cxx11::ostringstream::str();
          SetError(this,&local_2b8);
          std::__cxx11::string::~string((string *)&local_2b8);
          this_local = (cmCommandArgumentParserHelper *)0x0;
          c._4_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream(local_298);
        }
      }
    }
  }
  return this_local->EmptyVariable;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandSpecialVariable(const char* key,
                                                           const char* var)
{
  if (!key) {
    return this->ExpandVariable(var);
  }
  if (!var) {
    return this->EmptyVariable;
  }
  if (strcmp(key, "ENV") == 0) {
    std::string str;
    if (cmSystemTools::GetEnv(var, str)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmSystemTools::EscapeQuotes(str));
      }
      return this->AddString(str);
    }
    return this->EmptyVariable;
  }
  if (strcmp(key, "CACHE") == 0) {
    if (const char* c =
          this->Makefile->GetState()->GetInitializedCacheValue(var)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmSystemTools::EscapeQuotes(c));
      }
      return this->AddString(c);
    }
    return this->EmptyVariable;
  }
  std::ostringstream e;
  e << "Syntax $" << key << "{} is not supported.  "
    << "Only ${}, $ENV{}, and $CACHE{} are allowed.";
  this->SetError(e.str());
  return CM_NULLPTR;
}